

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::removeSatisfiedClause(Solver *this,CRef cr,bool remove_from_proof)

{
  bool bVar1;
  ulong uVar2;
  anon_struct_8_10_eb538618_for_header *c;
  vec<Minisat::Lit> unitClause;
  Lit unit;
  
  if (this->drup_file != (FILE *)0x0) {
    c = (anon_struct_8_10_eb538618_for_header *)
        ((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
    bVar1 = locked(this,(Clause *)c);
    if (bVar1) {
      if (SUB84(*c,4) >> 2 == 2) {
        unitClause.data =
             (Lit *)CONCAT71(unitClause.data._1_7_,
                             (byte)*(int *)(c + 1) & 1 ^
                             (this->assigns).data[*(int *)(c + 1) >> 1].value);
        bVar1 = lbool::operator==((lbool *)&unitClause,(lbool)0x0);
        uVar2 = (ulong)!bVar1;
      }
      else {
        uVar2 = 0;
      }
      unit.x = *(int *)(&c[1].field_0x0 + uVar2 * 4);
      unitClause.data = (Lit *)0x0;
      unitClause.sz = 0;
      unitClause.cap = 0;
      vec<Minisat::Lit>::push(&unitClause,&unit);
      binDRUP<Minisat::vec<Minisat::Lit>>(this,'a',&unitClause,this->drup_file);
      vec<Minisat::Lit>::~vec(&unitClause);
    }
  }
  removeClause(this,cr,remove_from_proof);
  return;
}

Assistant:

void Solver::removeSatisfiedClause(CRef cr, bool remove_from_proof)
{
    Clause &c = ca[cr];

    if (drup_file && locked(c)) {
        // The following line was copied from Solver::locked.
        int i = c.size() != 2 ? 0 : (value(c[0]) == l_True ? 0 : 1);
        Lit unit = c[i];
#ifdef BIN_DRUP
        vec<Lit> unitClause;
        unitClause.push(unit);
        binDRUP('a', unitClause, drup_file);
#else
        fprintf(drup_file, "%i 0\n", (var(unit) + 1) * (-2 * sign(unit) + 1));
#endif
    }

    removeClause(cr, remove_from_proof);
}